

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

size_t vkt::api::anon_unknown_1::getCurrentSystemMemoryUsage
                 (AllocationCallbackRecorder *allocRecoder)

{
  size_t sVar1;
  TestError *this;
  AllocationCallbackValidationResults validationResults;
  
  ::vk::AllocationCallbackValidationResults::AllocationCallbackValidationResults(&validationResults)
  ;
  ::vk::validateAllocationCallbacks(allocRecoder,&validationResults);
  if (validationResults.violations.
      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      validationResults.violations.
      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar1 = ::vk::getLiveSystemAllocationTotal(&validationResults);
    ::vk::AllocationCallbackValidationResults::~AllocationCallbackValidationResults
              (&validationResults);
    return (((long)validationResults.liveAllocations.
                   super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)validationResults.liveAllocations.
                  super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30) * 0x10 + sVar1;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"validationResults.violations.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
             ,0x14b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

size_t getCurrentSystemMemoryUsage (const AllocationCallbackRecorder& allocRecoder)
{
	const size_t						systemAllocationOverhead	= sizeof(void*)*2;
	AllocationCallbackValidationResults	validationResults;

	validateAllocationCallbacks(allocRecoder, &validationResults);
	TCU_CHECK(validationResults.violations.empty());

	return getLiveSystemAllocationTotal(validationResults) + systemAllocationOverhead*validationResults.liveAllocations.size();
}